

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O3

opj_bool j2k_set_decode_area(opj_j2k_v2_t *p_j2k,opj_image_t *p_image,OPJ_INT32 p_start_x,
                            OPJ_INT32 p_start_y,OPJ_INT32 p_end_x,OPJ_INT32 p_end_y,
                            opj_event_mgr *p_manager)

{
  byte *pbVar1;
  OPJ_UINT32 OVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  OPJ_UINT32 OVar6;
  opj_image_t *poVar7;
  OPJ_UINT32 OVar8;
  OPJ_UINT32 OVar9;
  undefined8 in_RAX;
  byte bVar10;
  ulong uVar11;
  char *fmt;
  int iVar12;
  OPJ_UINT32 OVar13;
  ulong uVar14;
  uint uVar15;
  opj_image_comp_t *poVar16;
  opj_bool oVar17;
  uint uVar18;
  undefined4 uVar19;
  
  uVar19 = (undefined4)((ulong)in_RAX >> 0x20);
  if ((p_j2k->m_specific_param).m_decoder.m_state != 8) {
    opj_event_msg_v2(p_manager,1,
                     "Need to decode the main header before begin to decode the remaining codestream"
                    );
    return 0;
  }
  uVar11 = (ulong)(uint)p_start_x;
  if (((p_start_y == 0 && p_start_x == 0) && p_end_x == 0) && p_end_y == 0) {
    opj_event_msg_v2(p_manager,4,
                     "No decoded area parameters, set the decoded area to the whole image\n");
    *(undefined8 *)((long)&p_j2k->m_specific_param + 0x20) = 0;
    (p_j2k->m_specific_param).m_encoder.m_encoded_tile_data = *(OPJ_BYTE **)&(p_j2k->m_cp).tw;
LAB_001285f7:
    oVar17 = 1;
  }
  else {
    poVar7 = p_j2k->m_private_image;
    uVar14 = (ulong)poVar7->x1;
    if (poVar7->x1 < (uint)p_start_x) {
      fmt = 
      "Left position of the decoded area (region_x0=%d) is outside the image area (Xsiz=%d).\n";
    }
    else {
      if ((uint)p_start_x < poVar7->x0) {
        opj_event_msg_v2(p_manager,2,
                         "Left position of the decoded area (region_x0=%d) is outside the image area (XOsiz=%d).\n"
                        );
        (p_j2k->m_specific_param).m_decoder.m_start_tile_x = 0;
        p_start_x = poVar7->x0;
      }
      else {
        (p_j2k->m_specific_param).m_decoder.m_start_tile_x =
             (p_start_x - (p_j2k->m_cp).tx0) / (p_j2k->m_cp).tdx;
      }
      p_image->x0 = p_start_x;
      uVar14 = (ulong)poVar7->y1;
      if (poVar7->y1 < (uint)p_start_y) {
        fmt = 
        "Up position of the decoded area (region_y0=%d) is outside the image area (Ysiz=%d).\n";
        uVar11 = (ulong)(uint)p_start_y;
      }
      else {
        if ((uint)p_start_y < poVar7->y0) {
          opj_event_msg_v2(p_manager,2,
                           "Up position of the decoded area (region_y0=%d) is outside the image area (YOsiz=%d).\n"
                           ,(ulong)(uint)p_start_y);
          (p_j2k->m_specific_param).m_decoder.m_start_tile_y = 0;
          p_start_y = poVar7->y0;
        }
        else {
          (p_j2k->m_specific_param).m_decoder.m_start_tile_y =
               (p_start_y - (p_j2k->m_cp).ty0) / (p_j2k->m_cp).tdy;
        }
        p_image->y0 = p_start_y;
        uVar14 = (ulong)poVar7->x0;
        if ((uint)p_end_x < poVar7->x0) {
          fmt = 
          "Right position of the decoded area (region_x1=%d) is outside the image area (XOsiz=%d).\n"
          ;
          uVar11 = (ulong)(uint)p_end_x;
        }
        else {
          if (poVar7->x1 < (uint)p_end_x) {
            opj_event_msg_v2(p_manager,2,
                             "Right position of the decoded area (region_x1=%d) is outside the image area (Xsiz=%d).\n"
                             ,(ulong)(uint)p_end_x);
            (p_j2k->m_specific_param).m_decoder.m_end_tile_x = (p_j2k->m_cp).tw;
            p_end_x = poVar7->x1;
          }
          else {
            OVar2 = (p_j2k->m_cp).tdx;
            (p_j2k->m_specific_param).m_decoder.m_end_tile_x =
                 (int)(~(p_j2k->m_cp).tx0 + p_end_x + OVar2) / (int)OVar2;
          }
          p_image->x1 = p_end_x;
          uVar14 = (ulong)poVar7->y0;
          if (poVar7->y0 <= (uint)p_end_y) {
            if (poVar7->y1 < (uint)p_end_y) {
              opj_event_msg_v2(p_manager,2,
                               "Bottom position of the decoded area (region_y1=%d) is outside the image area (Ysiz=%d).\n"
                               ,(ulong)(uint)p_end_y);
              (p_j2k->m_specific_param).m_decoder.m_end_tile_y = (p_j2k->m_cp).th;
              p_end_y = poVar7->y1;
            }
            else {
              OVar2 = (p_j2k->m_cp).tdy;
              (p_j2k->m_specific_param).m_decoder.m_end_tile_y =
                   (int)(~(p_j2k->m_cp).ty0 + p_end_y + OVar2) / (int)OVar2;
            }
            p_image->y1 = p_end_y;
            pbVar1 = (byte *)((long)&p_j2k->m_specific_param + 0x54);
            *pbVar1 = *pbVar1 | 2;
            OVar2 = p_image->numcomps;
            uVar3 = p_image->x0;
            uVar4 = p_image->y0;
            uVar5 = p_image->x1;
            if (OVar2 == 0) {
              OVar13 = p_image->y1;
            }
            else {
              poVar16 = p_image->comps;
              uVar15 = 0;
              do {
                OVar13 = poVar16->dx;
                OVar6 = poVar16->dy;
                OVar8 = (int)(OVar13 + uVar3 + -1) / (int)OVar13;
                poVar16->x0 = OVar8;
                OVar9 = (int)(uVar4 + OVar6 + -1) / (int)OVar6;
                poVar16->y0 = OVar9;
                bVar10 = (byte)poVar16->factor;
                iVar12 = -1 << (bVar10 & 0x1f);
                uVar18 = ((int)(iVar12 - OVar8) >> (bVar10 & 0x1f)) -
                         (iVar12 - (int)(OVar13 + uVar5 + -1) / (int)OVar13 >> (bVar10 & 0x1f));
                if ((int)uVar18 < 0) {
                  fmt = "Size x of the decoded component image is incorrect (comp[%d].w=%d).\n";
                  uVar11 = (ulong)uVar15;
                  uVar14 = (ulong)uVar18;
                  goto LAB_0012873a;
                }
                OVar13 = p_image->y1;
                poVar16->w = uVar18;
                uVar18 = ((int)(iVar12 - OVar9) >> (bVar10 & 0x1f)) -
                         (iVar12 - (int)((OVar6 - 1) + OVar13) / (int)OVar6 >> (bVar10 & 0x1f));
                if ((int)uVar18 < 0) {
                  fmt = "Size y of the decoded component image is incorrect (comp[%d].h=%d).\n";
                  uVar11 = (ulong)uVar15;
                  uVar14 = (ulong)uVar18;
                  goto LAB_0012873a;
                }
                poVar16->h = uVar18;
                poVar16 = poVar16 + 1;
                uVar15 = uVar15 + 1;
              } while (OVar2 != uVar15);
            }
            opj_event_msg_v2(p_manager,4,"Setting decoding area to %d,%d,%d,%d\n",(ulong)uVar3,
                             (ulong)uVar4,(ulong)uVar5,CONCAT44(uVar19,OVar13));
            goto LAB_001285f7;
          }
          fmt = 
          "Bottom position of the decoded area (region_y1=%d) is outside the image area (YOsiz=%d).\n"
          ;
          uVar11 = (ulong)(uint)p_end_y;
        }
      }
    }
LAB_0012873a:
    oVar17 = 0;
    opj_event_msg_v2(p_manager,1,fmt,uVar11,uVar14);
  }
  return oVar17;
}

Assistant:

opj_bool j2k_set_decode_area(	opj_j2k_v2_t *p_j2k,
								opj_image_t* p_image,
								OPJ_INT32 p_start_x, OPJ_INT32 p_start_y,
								OPJ_INT32 p_end_x, OPJ_INT32 p_end_y,
								struct opj_event_mgr * p_manager )
{
	opj_cp_v2_t * l_cp = &(p_j2k->m_cp);
	opj_image_t * l_image = p_j2k->m_private_image;

	OPJ_UINT32 it_comp;
	OPJ_INT32 l_comp_x1, l_comp_y1;
	opj_image_comp_t* l_img_comp = NULL;

	/* Check if we are read the main header */
	if (p_j2k->m_specific_param.m_decoder.m_state != J2K_STATE_TPHSOT) { /* FIXME J2K_DEC_STATE_TPHSOT)*/
		opj_event_msg_v2(p_manager, EVT_ERROR, "Need to decode the main header before begin to decode the remaining codestream");
		return OPJ_FALSE;
	}

	if ( !p_start_x && !p_start_y && !p_end_x && !p_end_y){
		opj_event_msg_v2(p_manager, EVT_INFO, "No decoded area parameters, set the decoded area to the whole image\n");

		p_j2k->m_specific_param.m_decoder.m_start_tile_x = 0;
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = 0;
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = l_cp->tw;
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = l_cp->th;

		return OPJ_TRUE;
	}

	/* ----- */
	/* Check if the positions provided by the user are correct */

	/* Left */
	if (p_start_x > l_image->x1 ) {
		opj_event_msg_v2(p_manager, EVT_ERROR,
			"Left position of the decoded area (region_x0=%d) is outside the image area (Xsiz=%d).\n",
			p_start_x, l_image->x1);
		return OPJ_FALSE;
	}
	else if (p_start_x < l_image->x0){
		opj_event_msg_v2(p_manager, EVT_WARNING,
				"Left position of the decoded area (region_x0=%d) is outside the image area (XOsiz=%d).\n",
				p_start_x, l_image->x0);
		p_j2k->m_specific_param.m_decoder.m_start_tile_x = 0;
		p_image->x0 = l_image->x0;
	}
	else {
		p_j2k->m_specific_param.m_decoder.m_start_tile_x = (p_start_x - l_cp->tx0) / l_cp->tdx;
		p_image->x0 = p_start_x;
	}

	/* Up */
	if (p_start_y > l_image->y1){
		opj_event_msg_v2(p_manager, EVT_ERROR,
				"Up position of the decoded area (region_y0=%d) is outside the image area (Ysiz=%d).\n",
				p_start_y, l_image->y1);
		return OPJ_FALSE;
	}
	else if (p_start_y < l_image->y0){
		opj_event_msg_v2(p_manager, EVT_WARNING,
				"Up position of the decoded area (region_y0=%d) is outside the image area (YOsiz=%d).\n",
				p_start_y, l_image->y0);
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = 0;
		p_image->y0 = l_image->y0;
	}
	else {
		p_j2k->m_specific_param.m_decoder.m_start_tile_y = (p_start_y - l_cp->ty0) / l_cp->tdy;
		p_image->y0 = p_start_y;
	}

	/* Right */
	if (p_end_x < l_image->x0) {
		opj_event_msg_v2(p_manager, EVT_ERROR,
			"Right position of the decoded area (region_x1=%d) is outside the image area (XOsiz=%d).\n",
			p_end_x, l_image->x0);
		return OPJ_FALSE;
	}
	else if (p_end_x > l_image->x1) {
		opj_event_msg_v2(p_manager, EVT_WARNING,
			"Right position of the decoded area (region_x1=%d) is outside the image area (Xsiz=%d).\n",
			p_end_x, l_image->x1);
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = l_cp->tw;
		p_image->x1 = l_image->x1;
	}
	else {
		p_j2k->m_specific_param.m_decoder.m_end_tile_x = int_ceildiv((p_end_x - l_cp->tx0), l_cp->tdx);
		p_image->x1 = p_end_x;
	}

	/* Bottom */
	if (p_end_y < l_image->y0) {
		opj_event_msg_v2(p_manager, EVT_ERROR,
			"Bottom position of the decoded area (region_y1=%d) is outside the image area (YOsiz=%d).\n",
			p_end_y, l_image->y0);
		return OPJ_FALSE;
	}
	if (p_end_y > l_image->y1){
		opj_event_msg_v2(p_manager, EVT_WARNING,
			"Bottom position of the decoded area (region_y1=%d) is outside the image area (Ysiz=%d).\n",
			p_end_y, l_image->y1);
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = l_cp->th;
		p_image->y1 = l_image->y1;
	}
	else{
		p_j2k->m_specific_param.m_decoder.m_end_tile_y = int_ceildiv((p_end_y - l_cp->ty0), l_cp->tdy);
		p_image->y1 = p_end_y;
	}
	/* ----- */

	p_j2k->m_specific_param.m_decoder.m_discard_tiles = 1;

	l_img_comp = p_image->comps;
	for (it_comp=0; it_comp < p_image->numcomps; ++it_comp)
	{
		OPJ_INT32 l_h,l_w;

		l_img_comp->x0 = int_ceildiv(p_image->x0, l_img_comp->dx);
		l_img_comp->y0 = int_ceildiv(p_image->y0, l_img_comp->dy);
		l_comp_x1 = int_ceildiv(p_image->x1, l_img_comp->dx);
		l_comp_y1 = int_ceildiv(p_image->y1, l_img_comp->dy);

		l_w = int_ceildivpow2(l_comp_x1, l_img_comp->factor)
				- int_ceildivpow2(l_img_comp->x0, l_img_comp->factor);
		if (l_w < 0){
			opj_event_msg_v2(p_manager, EVT_ERROR,
				"Size x of the decoded component image is incorrect (comp[%d].w=%d).\n",
				it_comp, l_w);
			return OPJ_FALSE;
		}
		l_img_comp->w = l_w;

		l_h = int_ceildivpow2(l_comp_y1, l_img_comp->factor)
				- int_ceildivpow2(l_img_comp->y0, l_img_comp->factor);
		if (l_h < 0){
			opj_event_msg_v2(p_manager, EVT_ERROR,
				"Size y of the decoded component image is incorrect (comp[%d].h=%d).\n",
				it_comp, l_h);
			return OPJ_FALSE;
		}
		l_img_comp->h = l_h;

		l_img_comp++;
	}

	opj_event_msg_v2( p_manager, EVT_INFO,"Setting decoding area to %d,%d,%d,%d\n",
			p_image->x0, p_image->y0, p_image->x1, p_image->y1);


	return OPJ_TRUE;
}